

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.cpp
# Opt level: O0

Expression * __thiscall
ExpressionUtils::queueToExp
          (ExpressionUtils *this,
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *queueValOp)

{
  value_type pEVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  Plus *this_00;
  Minus *this_01;
  Div *this_02;
  Mult *this_03;
  char *pcVar5;
  ulong uVar6;
  Num *pNVar7;
  Neg *pNVar8;
  Var *pVVar9;
  reference ppEVar10;
  double dVar11;
  undefined1 local_110 [40];
  undefined1 local_e8 [40];
  Expression *exp;
  Expression *firstNum;
  Expression *secondNum;
  value_type local_90;
  Expression *var;
  Expression *neg;
  Expression *num;
  undefined1 local_68 [8];
  stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> expStack;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *queueValOp_local;
  ExpressionUtils *this_local;
  
  expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)queueValOp;
  std::stack<Expression*,std::deque<Expression*,std::allocator<Expression*>>>::
  stack<std::deque<Expression*,std::allocator<Expression*>>,void>
            ((stack<Expression*,std::deque<Expression*,std::allocator<Expression*>>> *)local_68);
  while (bVar2 = std::
                 queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::empty((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)expStack.c.
                            super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node);
    std::__cxx11::string::string((string *)&secondNum,(string *)pvVar4);
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)expStack.c.super__Deque_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
    bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                             *)&secondNum,"+");
    if ((((bVar2) ||
         (bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                   *)&secondNum,"-"), bVar2)) ||
        (bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                  *)&secondNum,"*"), bVar2)) ||
       (bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                 *)&secondNum,"/"), bVar2)) {
      ppEVar10 = std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                 ::top((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                        *)local_68);
      firstNum = *ppEVar10;
      std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::pop
                ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> *)
                 local_68);
      ppEVar10 = std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                 ::top((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                        *)local_68);
      exp = *ppEVar10;
      std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::pop
                ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> *)
                 local_68);
      bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                               *)&secondNum,"+");
      if (bVar2) {
        this_00 = (Plus *)operator_new(0x18);
        Plus::Plus(this_00,exp,firstNum);
        local_e8._32_8_ = this_00;
        std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                  (&this->deathMap,(value_type *)(local_e8 + 0x20));
      }
      else {
        bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                 *)&secondNum,"-");
        if (bVar2) {
          this_01 = (Minus *)operator_new(0x18);
          Minus::Minus(this_01,exp,firstNum);
          local_e8._32_8_ = this_01;
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                    (&this->deathMap,(value_type *)(local_e8 + 0x20));
        }
        else {
          bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                   *)&secondNum,"/");
          if (bVar2) {
            this_02 = (Div *)operator_new(0x18);
            Div::Div(this_02,exp,firstNum);
            local_e8._32_8_ = this_02;
            std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                      (&this->deathMap,(value_type *)(local_e8 + 0x20));
          }
          else {
            bVar2 = std::operator==((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                     *)&secondNum,"*");
            if (bVar2) {
              this_03 = (Mult *)operator_new(0x18);
              Mult::Mult(this_03,exp,firstNum);
              local_e8._32_8_ = this_03;
              std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                        (&this->deathMap,(value_type *)(local_e8 + 0x20));
            }
          }
        }
      }
      std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::push
                ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> *)
                 local_68,(value_type *)(local_e8 + 0x20));
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&secondNum);
      if (*pcVar5 == '-') {
        uVar6 = std::__cxx11::string::find((char)&secondNum,0x2d);
        std::__cxx11::string::erase((ulong)&secondNum,uVar6);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&secondNum);
        iVar3 = isdigit((int)*pcVar5);
        if (iVar3 == 0) {
          pVVar9 = (Var *)operator_new(0x28);
          local_110[0x27] = '\x01';
          std::__cxx11::string::string((string *)local_e8,(string *)&secondNum);
          Var::Var(pVVar9,(string *)local_e8);
          local_110[0x27] = '\0';
          local_90 = (value_type)pVVar9;
          std::__cxx11::string::~string((string *)local_e8);
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                    (&this->deathMap,&local_90);
          pNVar8 = (Neg *)operator_new(0x10);
          Neg::Neg(pNVar8,local_90);
          var = (Expression *)pNVar8;
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back(&this->deathMap,&var);
          std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::push
                    ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                      *)local_68,&var);
        }
        else {
          pNVar7 = (Num *)operator_new(0x10);
          dVar11 = std::__cxx11::stod((string *)&secondNum,(size_t *)0x0);
          Num::Num(pNVar7,dVar11);
          neg = (Expression *)pNVar7;
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back(&this->deathMap,&neg);
          pNVar8 = (Neg *)operator_new(0x10);
          Neg::Neg(pNVar8,neg);
          var = (Expression *)pNVar8;
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back(&this->deathMap,&var);
          std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::push
                    ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                      *)local_68,&var);
        }
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&secondNum);
        iVar3 = isdigit((int)*pcVar5);
        if (iVar3 == 0) {
          pVVar9 = (Var *)operator_new(0x28);
          std::__cxx11::string::string((string *)local_110,(string *)&secondNum);
          Var::Var(pVVar9,(string *)local_110);
          local_90 = (value_type)pVVar9;
          std::__cxx11::string::~string((string *)local_110);
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back
                    (&this->deathMap,&local_90);
          std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::push
                    ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                      *)local_68,&local_90);
        }
        else {
          pNVar7 = (Num *)operator_new(0x10);
          dVar11 = std::__cxx11::stod((string *)&secondNum,(size_t *)0x0);
          Num::Num(pNVar7,dVar11);
          neg = (Expression *)pNVar7;
          std::vector<Expression_*,_std::allocator<Expression_*>_>::push_back(&this->deathMap,&neg);
          std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::push
                    ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                      *)local_68,&neg);
        }
      }
    }
    std::__cxx11::string::~string((string *)&secondNum);
  }
  ppEVar10 = std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::top
                       ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>
                         *)local_68);
  pEVar1 = *ppEVar10;
  std::stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_>::~stack
            ((stack<Expression_*,_std::deque<Expression_*,_std::allocator<Expression_*>_>_> *)
             local_68);
  return pEVar1;
}

Assistant:

Expression *ExpressionUtils::queueToExp(queue<string> &queueValOp) {
    //all tokens in queue - convert to Expressions
    stack<Expression *> expStack;
    while (!queueValOp.empty()) {
        Expression *num;
        Expression *neg;
        Expression *var;
        //take number from front
        string front = queueValOp.front();
        queueValOp.pop();
        if (front == "+" || front == "-" || front == "*" || front == "/") {//operator
            Expression *secondNum = expStack.top();
            expStack.pop();
            Expression *firstNum = expStack.top();
            expStack.pop();

            Expression *exp;
            if (front == "+") {
                exp = new Plus(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "-") {
                exp = new Minus(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "/") {
                exp = new Div(firstNum, secondNum);
                deathMap.push_back(exp);
            } else if (front == "*") {
                exp = new Mult(firstNum, secondNum);
                deathMap.push_back(exp);
            }
            expStack.push(exp);
        } else if (front[0] == '-') {//neg num
            front.erase(front.find('-'), 1);
            if (isdigit(front[0])) {//num
                num = new Num(stod(front));
                deathMap.push_back(num);
                neg = new Neg(num);
                deathMap.push_back(neg);
                expStack.push(neg);
            } else { //var
                var = new Var(front);
                deathMap.push_back(var);
                neg = new Neg(var);
                deathMap.push_back(neg);
                expStack.push(neg);
            }
        } else if (isdigit(front[0])) {//num
            num = new Num(stod(front));
            deathMap.push_back(num);
            expStack.push(num);
        } else { //var
            var = new Var(front);
            deathMap.push_back(var);
            expStack.push(var);
        }
    }
    //only one (complex) expression left on stack
    return expStack.top();
}